

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PairwiseRankLoss::forward_impl
          (PairwiseRankLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float fVar1;
  pointer ppTVar2;
  Tensor *pTVar3;
  Tensor *pTVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = *ppTVar2;
  uVar12 = (ulong)(pTVar3->d).nd;
  iVar8 = 1;
  iVar10 = 1;
  if (uVar12 != 0) {
    uVar13 = 0;
    do {
      iVar10 = iVar10 * (pTVar3->d).d[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  uVar11 = iVar10 * (pTVar3->d).bd;
  pTVar4 = ppTVar2[1];
  uVar12 = (ulong)(pTVar4->d).nd;
  if (uVar12 != 0) {
    iVar8 = 1;
    uVar13 = 0;
    do {
      iVar8 = iVar8 * (pTVar4->d).d[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  uVar9 = iVar8 * (pTVar4->d).bd;
  if (uVar11 == uVar9) {
    uVar12 = (ulong)(fx->d).nd;
    iVar8 = 1;
    if (uVar12 != 0) {
      uVar13 = 0;
      do {
        iVar8 = iVar8 * (fx->d).d[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (iVar8 * (fx->d).bd == uVar11) {
      if (uVar11 != 0) {
        pfVar5 = pTVar3->v;
        pfVar6 = pTVar4->v;
        fVar1 = this->margin;
        pfVar7 = fx->v;
        uVar12 = 0;
        do {
          fVar14 = (fVar1 - pfVar5[uVar12]) + pfVar6[uVar12];
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          pfVar7[uVar12] = fVar14;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<cnn::FPairwiseRankLoss, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FPairwiseRankLoss, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void PairwiseRankLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#if HAVE_CUDA
  gpu::vpairwise_rank_loss(fx.d.size(), margin, xs[0]->v, xs[1]->v, fx.v);
#else
  auto a = xs[0]->vec();
  auto b = xs[1]->vec();
  fx.vec() = a.binaryExpr(b, FPairwiseRankLoss(margin));
#endif
}